

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O2

void __thiscall bidfx_public_api::price::PricingSession::WaitForSubscriber(PricingSession *this)

{
  long in_RSI;
  
  WaitForSubscriber(this,(milliseconds)(in_RSI + -8));
  return;
}

Assistant:

std::unique_ptr<BulkSubscriber> PricingSession::WaitForSubscriber(std::chrono::milliseconds duration)
{
    if (running_.exchange(true))
    {
        // Pricing session was already running
        return std::make_unique<PricingSubscriber>(this, user_info_);
    }
    pixie_provider_->Start();
    pixie_provider_->WaitUntilReady(duration);
    return std::make_unique<PricingSubscriber>(this, user_info_);
}